

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O3

void __thiscall sznet::net::Channel::handleEventWithGuard(Channel *this,Timestamp receiveTime)

{
  char *pcVar1;
  uint uVar2;
  LogStream *pLVar3;
  char **ppcVar4;
  int ev;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  Logger local_1010;
  string local_40;
  
  this->m_eventHandling = true;
  if (g_logLevel < 1) {
    ev = 0x4c;
    file._8_8_ = 0xb;
    file.m_data = "Channel.cpp";
    Logger::Logger(&local_1010,file,0x4c,TRACE,"handleEventWithGuard");
    eventsToString_abi_cxx11_(&local_40,(Channel *)(ulong)(uint)this->m_fd,this->m_revents,ev);
    if (local_40._M_string_length <
        (ulong)(long)(((int)&local_1010 + 0xfb0) - (int)local_1010.m_impl.m_stream.m_buffer.m_cur))
    {
      memcpy(local_1010.m_impl.m_stream.m_buffer.m_cur,local_40._M_dataplus._M_p,
             local_40._M_string_length);
      local_1010.m_impl.m_stream.m_buffer.m_cur =
           local_1010.m_impl.m_stream.m_buffer.m_cur + local_40._M_string_length;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    Logger::~Logger(&local_1010);
  }
  if ((this->m_revents & 0x21) == 0x20) {
    if (this->m_logHup == true) {
      file_00._8_8_ = 0xb;
      file_00.m_data = "Channel.cpp";
      Logger::Logger(&local_1010,file_00,0x52,WARN);
      if (5 < (uint)(((int)&local_1010 + 0xfb0) - (int)local_1010.m_impl.m_stream.m_buffer.m_cur)) {
        builtin_strncpy(local_1010.m_impl.m_stream.m_buffer.m_cur,"fd = ",5);
        local_1010.m_impl.m_stream.m_buffer.m_cur = local_1010.m_impl.m_stream.m_buffer.m_cur + 5;
      }
      pLVar3 = LogStream::operator<<(&local_1010.m_impl.m_stream,this->m_fd);
      pcVar1 = (pLVar3->m_buffer).m_cur;
      ppcVar4 = &(pLVar3->m_buffer).m_cur;
      if (0x22 < (uint)((int)ppcVar4 - (int)pcVar1)) {
        builtin_strncpy(pcVar1," Channel::handle_event() kHupEvent",0x22);
        *ppcVar4 = *ppcVar4 + 0x22;
      }
      Logger::~Logger(&local_1010);
    }
    if ((this->m_closeCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->m_closeCallback)._M_invoker)((_Any_data *)&this->m_closeCallback);
    }
  }
  uVar2 = this->m_revents;
  if ((uVar2 & 0x40) != 0) {
    file_01._8_8_ = 0xb;
    file_01.m_data = "Channel.cpp";
    Logger::Logger(&local_1010,file_01,0x5e,WARN);
    if (5 < (uint)(((int)&local_1010 + 0xfb0) - (int)local_1010.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_1010.m_impl.m_stream.m_buffer.m_cur,"fd = ",5);
      local_1010.m_impl.m_stream.m_buffer.m_cur = local_1010.m_impl.m_stream.m_buffer.m_cur + 5;
    }
    pLVar3 = LogStream::operator<<(&local_1010.m_impl.m_stream,this->m_fd);
    pcVar1 = (pLVar3->m_buffer).m_cur;
    ppcVar4 = &(pLVar3->m_buffer).m_cur;
    if (0x23 < (uint)((int)ppcVar4 - (int)pcVar1)) {
      builtin_strncpy(pcVar1," Channel::handle_event() KNvalEvent",0x23);
      *ppcVar4 = *ppcVar4 + 0x23;
    }
    Logger::~Logger(&local_1010);
    uVar2 = this->m_revents;
  }
  if (((uVar2 & 0x50) != 0) &&
     ((this->m_errorCallback).super__Function_base._M_manager != (_Manager_type)0x0)) {
    (*(this->m_errorCallback)._M_invoker)((_Any_data *)&this->m_errorCallback);
    uVar2 = this->m_revents;
  }
  if (((uVar2 & 7) != 0) &&
     ((this->m_readCallback).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_1010.m_impl.m_time.m_microSecondsSinceEpoch = receiveTime.m_microSecondsSinceEpoch;
    (*(this->m_readCallback)._M_invoker)
              ((_Any_data *)&this->m_readCallback,(Timestamp *)&local_1010);
    uVar2 = this->m_revents;
  }
  if (((uVar2 & 8) != 0) &&
     ((this->m_writeCallback).super__Function_base._M_manager != (_Manager_type)0x0)) {
    (*(this->m_writeCallback)._M_invoker)((_Any_data *)&this->m_writeCallback);
  }
  this->m_eventHandling = false;
  return;
}

Assistant:

void Channel::handleEventWithGuard(Timestamp receiveTime)
{
	// 事件处理时，设置下此状态
	// Channel析构时，用到此状态 
	m_eventHandling = true;
	LOG_TRACE << reventsToString();
	// RCV_SHUTDOWN | SEND_SHUTDOWN
	if ((m_revents & kHupEvent) && !(m_revents & kReadEvent))
	{
		if (m_logHup)
		{
			LOG_WARN << "fd = " << m_fd << " Channel::handle_event() kHupEvent";
		}
		if (m_closeCallback)
		{
			m_closeCallback();
		}
	}

	// A POLLNVAL means the socket file descriptor is not open. 
	// It would be an error to close() it.
	if (m_revents & kNvalEvent)
	{
		LOG_WARN << "fd = " << m_fd << " Channel::handle_event() KNvalEvent";
	}

	// A POLLERR means error condition happened on the associated file descriptor.
	if (m_revents & (kErrorEvent | kNvalEvent))
	{
		if (m_errorCallback)
		{
			m_errorCallback();
		}
	}

	// 读事件
	if (m_revents & (kReadEvent | kPriEvent | kRdHupEvent))
	{
		if (m_readCallback)
		{
			m_readCallback(receiveTime);
		}
	}

	// 写事件
	if (m_revents & kWriteEvent)
	{
		if (m_writeCallback)
		{
			m_writeCallback();
		}
	}

	m_eventHandling = false;
}